

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_unary_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,char *op)

{
  bool forwarding;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  char *local_78;
  string local_70;
  string local_50;
  
  local_78 = op;
  forwarding = should_forward(this,op0);
  ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  to_enclosed_unpacked_expression_abi_cxx11_(&local_50,this,op0,true);
  join<char_const*&,std::__cxx11::string>
            (&local_70,(spirv_cross *)&local_78,(char **)&local_50,ts_1);
  emit_op(this,result_type,result_id,&local_70,forwarding,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  return;
}

Assistant:

void CompilerGLSL::emit_unary_op(uint32_t result_type, uint32_t result_id, uint32_t op0, const char *op)
{
	bool forward = should_forward(op0);
	emit_op(result_type, result_id, join(op, to_enclosed_unpacked_expression(op0)), forward);
	inherit_expression_dependencies(result_id, op0);
}